

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_find_target(ly_path *path,lyd_node *tree,lyd_node **match)

{
  LY_ERR LVar1;
  lyd_node *local_38;
  lyd_node *m;
  lyd_node **pplStack_28;
  LY_ERR ret;
  lyd_node **match_local;
  lyd_node *tree_local;
  ly_path *path_local;
  
  pplStack_28 = match;
  match_local = (lyd_node **)tree;
  tree_local = (lyd_node *)path;
  if (path == (ly_path *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","path","lyd_find_target");
    path_local._4_4_ = LY_EINVAL;
  }
  else {
    LVar1 = ly_path_eval(path,tree,(lyxp_var *)0x0,&local_38);
    if (LVar1 == LY_SUCCESS) {
      if (pplStack_28 != (lyd_node **)0x0) {
        *pplStack_28 = local_38;
      }
      path_local._4_4_ = LY_SUCCESS;
    }
    else {
      if (pplStack_28 != (lyd_node **)0x0) {
        *pplStack_28 = (lyd_node *)0x0;
      }
      path_local._4_4_ = LY_ENOTFOUND;
    }
  }
  return path_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_find_target(const struct ly_path *path, const struct lyd_node *tree, struct lyd_node **match)
{
    LY_ERR ret;
    struct lyd_node *m;

    LY_CHECK_ARG_RET(NULL, path, LY_EINVAL);

    ret = ly_path_eval(path, tree, NULL, &m);
    if (ret) {
        if (match) {
            *match = NULL;
        }
        return LY_ENOTFOUND;
    }

    if (match) {
        *match = m;
    }
    return LY_SUCCESS;
}